

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyRoutingData * ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)

{
  ImGuiKeyRoutingData *pIVar1;
  ImGuiKey in_EDI;
  ImGuiKeyRoutingIndex routing_data_idx;
  ImGuiKeyRoutingIndex idx;
  ImGuiKey mods;
  ImGuiKey key;
  ImGuiKeyRoutingData *routing_data;
  ImGuiKeyRoutingTable *rt;
  ImGuiContext *g;
  ImGuiKeyRoutingData *in_stack_ffffffffffffffa8;
  ImVector<ImGuiKeyRoutingData> *this;
  ImGuiKeyRoutingData local_44;
  short local_34;
  short local_32;
  ImGuiKey local_30;
  ImGuiKey local_2c;
  ImGuiKeyRoutingData *local_28;
  ImGuiKeyRoutingTable *local_20;
  ImGuiContext *local_18;
  
  local_18 = GImGui;
  local_20 = &GImGui->KeysRoutingTable;
  local_2c = in_EDI & ~ImGuiMod_Mask_;
  local_30 = in_EDI & ImGuiMod_Mask_;
  if (local_2c == ImGuiKey_KeysData_OFFSET) {
    local_2c = ConvertSingleModFlagToKey(local_30);
  }
  local_32 = local_20->Index[(int)(local_2c - ImGuiKey_NamedKey_BEGIN)];
  while( true ) {
    if (local_32 == -1) {
      local_34 = (short)(local_20->Entries).Size;
      this = &local_20->Entries;
      ImGuiKeyRoutingData::ImGuiKeyRoutingData(&local_44);
      ImVector<ImGuiKeyRoutingData>::push_back(this,in_stack_ffffffffffffffa8);
      pIVar1 = ImVector<ImGuiKeyRoutingData>::operator[](&local_20->Entries,(int)local_34);
      pIVar1->Mods = (ImU16)local_30;
      pIVar1->NextEntryIndex = local_20->Index[(int)(local_2c - ImGuiKey_NamedKey_BEGIN)];
      local_20->Index[(int)(local_2c - ImGuiKey_NamedKey_BEGIN)] = local_34;
      return pIVar1;
    }
    local_28 = ImVector<ImGuiKeyRoutingData>::operator[](&local_20->Entries,(int)local_32);
    if (local_28->Mods == local_30) break;
    local_32 = local_28->NextEntryIndex;
  }
  return local_28;
}

Assistant:

ImGuiKeyRoutingData* ImGui::GetShortcutRoutingData(ImGuiKeyChord key_chord)
{
    // Majority of shortcuts will be Key + any number of Mods
    // We accept _Single_ mod with ImGuiKey_None.
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl);                    // Legal
    //  - Shortcut(ImGuiKey_S | ImGuiMod_Ctrl | ImGuiMod_Shift);   // Legal
    //  - Shortcut(ImGuiMod_Ctrl);                                 // Legal
    //  - Shortcut(ImGuiMod_Ctrl | ImGuiMod_Shift);                // Not legal
    ImGuiContext& g = *GImGui;
    ImGuiKeyRoutingTable* rt = &g.KeysRoutingTable;
    ImGuiKeyRoutingData* routing_data;
    ImGuiKey key = (ImGuiKey)(key_chord & ~ImGuiMod_Mask_);
    ImGuiKey mods = (ImGuiKey)(key_chord & ImGuiMod_Mask_);
    if (key == ImGuiKey_None)
        key = ConvertSingleModFlagToKey(mods);
    IM_ASSERT(IsNamedKey(key));

    // Get (in the majority of case, the linked list will have one element so this should be 2 reads.
    // Subsequent elements will be contiguous in memory as list is sorted/rebuilt in NewFrame).
    for (ImGuiKeyRoutingIndex idx = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; idx != -1; idx = routing_data->NextEntryIndex)
    {
        routing_data = &rt->Entries[idx];
        if (routing_data->Mods == mods)
            return routing_data;
    }

    // Add to linked-list
    ImGuiKeyRoutingIndex routing_data_idx = (ImGuiKeyRoutingIndex)rt->Entries.Size;
    rt->Entries.push_back(ImGuiKeyRoutingData());
    routing_data = &rt->Entries[routing_data_idx];
    routing_data->Mods = (ImU16)mods;
    routing_data->NextEntryIndex = rt->Index[key - ImGuiKey_NamedKey_BEGIN]; // Setup linked list
    rt->Index[key - ImGuiKey_NamedKey_BEGIN] = routing_data_idx;
    return routing_data;
}